

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
          (buffer_appender<char> out,unsigned_long value,basic_format_specs<char> *specs)

{
  bool bVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  size_t sVar3;
  size_t size;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  buffer<char> *buf;
  unsigned_long uVar7;
  undefined8 uStack_40;
  char local_38 [8];
  char buffer [17];
  anon_class_16_2_92d121e5 write;
  
  size = 2;
  uVar7 = value;
  do {
    sVar3 = size;
    size = sVar3 + 1;
    bVar1 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar1);
  unique0x10000150 = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    uVar4 = size + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                   container + 0x10);
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar4) {
      uStack_40 = 0x236de9;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,uVar4);
    }
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_40 = 0x236dfe;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar5 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar5 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar5) = 0x30;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_40 = 0x236e27;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar5 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar5 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar5) = 0x78;
    lVar5 = (long)((int)sVar3 + -1);
    pcVar6 = local_38 + lVar5 + -1;
    uVar7 = stack0xffffffffffffffe0;
    do {
      *pcVar6 = "0123456789abcdef"[(uint)uVar7 & 0xf];
      pcVar6 = pcVar6 + -1;
      bVar1 = 0xf < uVar7;
      uVar7 = uVar7 >> 4;
    } while (bVar1);
    uStack_40 = 0x236e86;
    bVar2.container =
         (buffer<char> *)
         std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char*,fmt::v7::detail::buffer_appender<char>>(local_38,local_38 + lVar5,out);
  }
  else {
    uStack_40 = 0x236dcf;
    bVar2.container =
         (buffer<char> *)
         write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>(fmt::v7::detail::buffer_appender<char>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                   (out,specs,size,size,(anon_class_16_2_92d121e5 *)(buffer + 0x10));
  }
  return (buffer_appender<char>)bVar2.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}